

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnExpr(BinaryReaderInterp *this)

{
  bool bVar1;
  size_type sVar2;
  Location local_50;
  Enum local_30;
  Enum local_2c;
  Enum local_28;
  u32 local_24;
  u32 local_20;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  BinaryReaderInterp *this_local;
  
  _keep_count = this;
  local_28 = (Enum)GetReturnDropKeepCount(this,&catch_drop_count,&local_20);
  bVar1 = Failed((Result)local_28);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar2 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    local_2c = (Enum)SharedValidator::GetCatchCount(&this->validator_,(int)sVar2 - 1,&local_24);
    bVar1 = Failed((Result)local_2c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      GetLocation(&local_50,this);
      local_30 = (Enum)SharedValidator::OnReturn(&this->validator_,&local_50);
      bVar1 = Failed((Result)local_30);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Istream::EmitDropKeep(this->istream_,catch_drop_count,local_20);
        Istream::EmitCatchDrop(this->istream_,local_24);
        Istream::Emit(this->istream_,Return);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnReturnExpr() {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  CHECK_RESULT(validator_.OnReturn(GetLocation()));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);
  istream_.Emit(Opcode::Return);
  return Result::Ok;
}